

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypesHierarchy.cpp
# Opt level: O2

set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> * __thiscall
TypesHierarchy::GetCompositesForTypes
          (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
           *__return_storage_ptr__,TypesHierarchy *this,TYPE_ID type)

{
  _Rb_tree_header *p_Var1;
  pointer pvVar2;
  TYPE_ID *pTVar3;
  ulong uVar4;
  undefined1 local_70 [8];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> tmp;
  TYPE_ID local_38;
  uint local_34;
  TYPE_ID type_local;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  tmp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&tmp;
  tmp._M_t._M_impl._0_4_ = 0;
  tmp._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tmp._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  tmp._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  pvVar2 = (this->types).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  tmp._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       tmp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  tmp._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  local_38 = type;
  for (uVar4 = (ulong)this->CompositeStartFrom;
      uVar4 < (ulong)((*(long *)(tmp._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x30) -
                      (long)pvVar2) / 0x18); uVar4 = uVar4 + 1) {
    for (pTVar3 = pvVar2[uVar4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pTVar3 != *(pointer *)
                   ((long)&pvVar2[uVar4].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data + 8); pTVar3 = pTVar3 + 1) {
      if (*pTVar3 == type) {
        local_34 = (uint)uVar4;
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_M_insert_unique<unsigned_int>(&__return_storage_ptr__->_M_t,&local_34);
        pvVar2 = *(pointer *)(tmp._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x28);
      }
    }
  }
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)__return_storage_ptr__,&local_38);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)local_70);
  return __return_storage_ptr__;
}

Assistant:

set<TYPE_ID> TypesHierarchy::GetCompositesForTypes(TYPE_ID type) {
	vector<TYPE_ID>::iterator it2;
	set<TYPE_ID> vect;
	set<TYPE_ID> tmp;

	for (size_t i = CompositeStartFrom; i < types.size(); i++) {
		for (it2 = types[i].begin(); it2 != types[i].end(); it2++) {
			if (*it2 == type) {
//				cerr << i << endl;
//				tmp = GetGenericTypes(*it2);
//				vect.insert( tmp.begin(), tmp.end() );
				vect.insert(i);
			}
		}
	}
	vect.insert(type);
	return vect;
}